

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O2

void UI::execute_scale(int *argc,char **argv)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  double factor_00;
  string factor;
  string outfile_name;
  string geo_file_name;
  geofile primary_geofile;
  allocator<char> local_361;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260 [32];
  string local_240;
  string local_220;
  geofile local_200;
  
  if (*argc == 6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,argv[3],(allocator<char> *)&local_200);
    std::__cxx11::string::string<std::allocator<char>>
              (local_260,argv[4],(allocator<char> *)&local_200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,argv[5],(allocator<char> *)&local_200);
    bVar1 = GEO::is_e_notation(&local_360);
    if (bVar1) {
      GEO::geofile::geofile(&local_200);
      std::__cxx11::string::string((string *)&local_280,(string *)&local_240);
      iVar2 = GEO::geofile::import_geofile(&local_200,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      if (iVar2 == 0) {
        factor_00 = std::__cxx11::stod(&local_360,(size_t *)0x0);
        iVar2 = GEO::geofile::scale_data(&local_200,factor_00);
        if (iVar2 == 0) {
          std::__cxx11::string::string((string *)&local_2a0,local_260);
          iVar2 = GEO::geofile::export_geofile(&local_200,&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          if (iVar2 == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2c0,"Export Succeeded.",&local_361);
            print_ln(&local_2c0);
            psVar3 = &local_2c0;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2e0,"Error: Export failed.",&local_361);
            print_ln(&local_2e0);
            psVar3 = &local_2e0;
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_300,"Error: Scaling failed.",&local_361);
          print_ln(&local_300);
          psVar3 = &local_300;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_320,"Error: Import of Geofile failed.",&local_361);
        print_ln(&local_320);
        psVar3 = &local_320;
      }
      std::__cxx11::string::~string((string *)psVar3);
      GEO::geofile::~geofile(&local_200);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_340,"Error: Scaling factor not valid.",
                 (allocator<char> *)&local_200);
      print_ln(&local_340);
      std::__cxx11::string::~string((string *)&local_340);
    }
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string(local_260);
    psVar3 = &local_240;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"Error: incorrect argument count.",(allocator<char> *)&local_200
              );
    print_ln(&local_220);
    psVar3 = &local_220;
  }
  std::__cxx11::string::~string((string *)psVar3);
  return;
}

Assistant:

void UI::execute_scale(int &argc, char *argv[])
{
    if (argc!=6)
    {
        print_ln("Error: incorrect argument count.");
    }
    else
    {
        std::string geo_file_name   = argv[3];
        std::string outfile_name    = argv[4];
        std::string factor          = argv[5];
        if (GEO::is_e_notation(factor))
        {
            GEO::geofile primary_geofile;
            if (primary_geofile.import_geofile(geo_file_name)==EXIT_SUCCESS)
            {
                double fac=std::stod(factor);
                if(primary_geofile.scale_data(fac)==EXIT_SUCCESS)
                {
                    if (primary_geofile.export_geofile(outfile_name)==EXIT_SUCCESS)
                        print_ln("Export Succeeded.");
                    else
                        print_ln("Error: Export failed.");
                }
                else
                    print_ln("Error: Scaling failed.");
            }
            else
                print_ln("Error: Import of Geofile failed.");
        }
        else
            print_ln("Error: Scaling factor not valid.");
    }
}